

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::Group::Group(Group *this,string *help_,function<bool_(const_args::Group_&)> *validator_,
                  Options options_)

{
  Options options__local;
  function<bool_(const_args::Group_&)> *validator__local;
  string *help__local;
  Group *this_local;
  
  Base::Base(&this->super_Base,help_,options_);
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Group_0013f580;
  std::vector<args::Base_*,_std::allocator<args::Base_*>_>::vector(&this->children);
  std::function<bool_(const_args::Group_&)>::function(&this->validator,validator_);
  return;
}

Assistant:

Group(const std::string &help_ = std::string(), const std::function<bool(const Group &)> &validator_ = Validators::DontCare, Options options_ = {}) : Base(help_, options_), validator(validator_) {}